

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O1

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  Expression **ppEVar1;
  pointer pTVar2;
  undefined1 auStack_1e8 [8];
  Walker walker;
  Expression *curr_local;
  
  walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&walker.mapper.labelMappings;
  auStack_1e8 = (undefined1  [8])0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep = (Expression **)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currFunction = (Function *)0x0
  ;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule = (Module *)0x0;
  walker.mapper.labelMappings._M_t._M_impl._0_4_ = 0;
  walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.fixed._M_elems[9] = (Expression *)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
  controlFlowStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&walker.mapper.reverseLabelMapping;
  walker.mapper.reverseLabelMapping._M_t._M_impl._0_4_ = 0;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       walker.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  walker.mapper._120_8_ = curr;
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)auStack_1e8,
             ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan,
             (Expression **)&walker.mapper.otherIndex);
  if (((long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
             _M_elems[9].currp >> 4) +
      (long)walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep != 0) {
    do {
      if ((pointer)walker.
                   super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x5a,
                        "T &wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
                       );
        }
        pTVar2 = (pointer)((long)(&walker.
                                   super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                   .
                                   super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                   .
                                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                   .stack.fixed + -1) + 0x88 +
                          (long)walker.
                                super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                .
                                super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                                .replacep * 0x10);
      }
      else {
        pTVar2 = walker.
                 super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar1 = pTVar2->currp;
      if ((pointer)walker.
                   super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                   _M_elems[9].currp ==
          walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x51,
                        "void wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::pop_back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
                       );
        }
        walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
             (Expression **)
             ((long)walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep +
             -1);
      }
      else {
        walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
             super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_1e8 = (undefined1  [8])ppEVar1;
      if (*ppEVar1 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                      ,0x139,
                      "void wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::UnifiedExpressionVisitor<Walker>]"
                     );
      }
      (*pTVar2->func)((Walker *)auStack_1e8,ppEVar1);
    } while (((long)walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                    flexible.
                    super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                    _M_elems[9].currp >> 4) +
             (long)walker.
                   super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                   super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep != 0
            );
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)&walker.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
               *)&walker.mapper.labelStack.
                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      controlFlowStack.flexible.
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    controlFlowStack.flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)walker.mapper.labelStack.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .controlFlowStack.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      controlFlowStack.fixed._M_elems[9] != (Expression *)0x0) {
    operator_delete(walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    controlFlowStack.fixed._M_elems[9],
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .controlFlowStack.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .controlFlowStack.fixed._M_elems[9]);
  }
  if (walker.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
      super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(walker.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                    _M_elems[9].currp,
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)walker.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  };

  Walker walker;
  walker.walk(curr);
}